

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalCreateARTIndex,duckdb::LogicalCreateIndex&,duckdb::TableCatalogEntry&,duckdb::vector<unsigned_long,true>&,duckdb::unique_ptr<duckdb::CreateIndexInfo,std::default_delete<duckdb::CreateIndexInfo>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&,bool&,duckdb::unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>,true>>
          (PhysicalPlan *this,LogicalCreateIndex *args,TableCatalogEntry *args_1,
          vector<unsigned_long,_true> *args_2,
          unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
          *args_3,vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *args_4,unsigned_long *args_5,bool *args_6,
          unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
          *args_7)

{
  pointer *pprVar1;
  bool sorted;
  idx_t estimated_cardinality;
  iterator __position;
  PhysicalCreateARTIndex *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::AlterTableInfo_*,_false> local_68;
  _Head_base<0UL,_duckdb::CreateIndexInfo_*,_false> local_60;
  vector<unsigned_long,_true> *local_58;
  reference_wrapper<duckdb::PhysicalOperator> local_50;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_48;
  
  local_58 = args_2;
  this_00 = (PhysicalCreateARTIndex *)ArenaAllocator::AllocateAligned(&this->arena,0xd0);
  local_60._M_head_impl =
       (args_3->
       super_unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateIndexInfo_*,_std::default_delete<duckdb::CreateIndexInfo>_>
       .super__Head_base<0UL,_duckdb::CreateIndexInfo_*,_false>._M_head_impl;
  (args_3->super_unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::CreateIndexInfo_*,_std::default_delete<duckdb::CreateIndexInfo>_>.
  super__Head_base<0UL,_duckdb::CreateIndexInfo_*,_false>._M_head_impl = (CreateIndexInfo *)0x0;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_4->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_4->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_4->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_4->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args_4->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_4->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  estimated_cardinality = *args_5;
  sorted = *args_6;
  local_68._M_head_impl =
       (args_7->
       super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
       .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl;
  (args_7->super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>.
  super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl = (AlterTableInfo *)0x0;
  PhysicalCreateARTIndex::PhysicalCreateARTIndex
            (this_00,&args->super_LogicalOperator,args_1,local_58,
             (unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
              *)&local_60,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_48,estimated_cardinality,sorted,
             (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
              *)&local_68);
  if (local_68._M_head_impl != (AlterTableInfo *)0x0) {
    (*((local_68._M_head_impl)->super_AlterInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  local_68._M_head_impl = (AlterTableInfo *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_48);
  if (local_60._M_head_impl != (CreateIndexInfo *)0x0) {
    (*((local_60._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  local_60._M_head_impl = (CreateIndexInfo *)0x0;
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50._M_data = (PhysicalOperator *)this_00;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,&local_50);
  }
  else {
    (__position._M_current)->_M_data = (PhysicalOperator *)this_00;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}